

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

TriggerStep *
sqlite3TriggerDeleteStep(Parse *pParse,Token *pTableName,Expr *pWhere,char *zStart,char *zEnd)

{
  sqlite3 *db;
  TriggerStep *pTVar1;
  Expr *pEVar2;
  
  db = pParse->db;
  pTVar1 = triggerStepAllocate(pParse,'u',pTableName,zStart,zEnd);
  if (pTVar1 != (TriggerStep *)0x0) {
    if (pParse->eParseMode < 2) {
      if (pWhere == (Expr *)0x0) {
        pEVar2 = (Expr *)0x0;
      }
      else {
        pEVar2 = exprDup(db,pWhere,1,(u8 **)0x0);
      }
    }
    else {
      pEVar2 = pWhere;
      pWhere = (Expr *)0x0;
    }
    pTVar1->pWhere = pEVar2;
    pTVar1->orconf = '\v';
  }
  if (pWhere != (Expr *)0x0) {
    sqlite3ExprDeleteNN(db,pWhere);
  }
  return pTVar1;
}

Assistant:

SQLITE_PRIVATE TriggerStep *sqlite3TriggerDeleteStep(
  Parse *pParse,          /* Parser */
  Token *pTableName,      /* The table from which rows are deleted */
  Expr *pWhere,           /* The WHERE clause */
  const char *zStart,     /* Start of SQL text */
  const char *zEnd        /* End of SQL text */
){
  sqlite3 *db = pParse->db;
  TriggerStep *pTriggerStep;

  pTriggerStep = triggerStepAllocate(pParse, TK_DELETE, pTableName,zStart,zEnd);
  if( pTriggerStep ){
    if( IN_RENAME_OBJECT ){
      pTriggerStep->pWhere = pWhere;
      pWhere = 0;
    }else{
      pTriggerStep->pWhere = sqlite3ExprDup(db, pWhere, EXPRDUP_REDUCE);
    }
    pTriggerStep->orconf = OE_Default;
  }
  sqlite3ExprDelete(db, pWhere);
  return pTriggerStep;
}